

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  FILE *__stream;
  
  uVar1 = gdImageCreateTrueColor(400,400);
  gdImageFilledRectangle(uVar1,0,0,399,399,0xffffff);
  gdImageFilledArc(uVar1,0x3c,0x153,0x78,0x78,0x5a,0xb4,0,0);
  __stream = fopen("b.png","wb");
  if (__stream == (FILE *)0x0) {
    fwrite("Can\'t save png image.\n",0x16,1,_stderr);
  }
  else {
    puts("No PNG support. Cannot save image.");
    fclose(__stream);
  }
  gdImageDestroy(uVar1);
  return (uint)(__stream == (FILE *)0x0);
}

Assistant:

int main()
{
	gdImagePtr im;
	FILE *fp;
	int cor_rad = 60;
	im = gdImageCreateTrueColor(400, 400);
	gdImageFilledRectangle(im, 0, 0, 399, 399, 0x00FFFFFF);

	gdImageFilledArc (im, cor_rad, 399 - cor_rad, cor_rad *2, cor_rad *2, 90, 180, 0x0, gdPie);

	fp = fopen("b.png", "wb");
	if (!fp) {
		fprintf(stderr, "Can't save png image.\n");
		gdImageDestroy(im);
		return 1;
	}
#ifdef HAVE_LIBPNG
	gdImagePng(im, fp);
#else
	printf("No PNG support. Cannot save image.\n");
#endif
	fclose(fp);

	gdImageDestroy(im);
	return 0;
}